

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::piece_picker::is_requested(piece_picker *this,piece_block block)

{
  download_queue_t queue;
  iterator dp;
  bool bVar1;
  span<libtorrent::aux::piece_picker::block_info> sVar2;
  
  queue = piece_pos::download_queue
                    ((this->m_piece_map).
                     super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                     .
                     super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                     ._M_impl.super__Vector_impl_data._M_start + block.piece_index.m_val.m_val);
  if (queue.m_val == '\x04') {
    bVar1 = false;
  }
  else {
    dp = find_dl_piece(this,queue,block.piece_index.m_val);
    sVar2 = mutable_blocks_for_piece(this,dp._M_current);
    bVar1 = (*(ushort *)&sVar2.m_ptr[(long)block >> 0x20].field_0x8 & 0xc000) == 0x4000;
  }
  return bVar1;
}

Assistant:

bool piece_picker::is_requested(piece_block const block) const
	{
		TORRENT_ASSERT(block.block_index != piece_block::invalid.block_index);
		TORRENT_ASSERT(block.piece_index != piece_block::invalid.piece_index);
		TORRENT_ASSERT(block.piece_index < m_piece_map.end_index());

		auto const state = m_piece_map[block.piece_index].download_queue();
		if (state == piece_pos::piece_open) return false;
		auto const i = find_dl_piece(state, block.piece_index);

		TORRENT_ASSERT(i != m_downloads[state].end());

		auto const info = blocks_for_piece(*i);
		TORRENT_ASSERT(info[block.block_index].piece_index == block.piece_index);
		return info[block.block_index].state == block_info::state_requested;
	}